

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TPZParFrontStructMatrix.cpp
# Opt level: O3

void __thiscall
TPZParFrontStructMatrix<TPZFrontNonSym<double>,_double,_TPZStructMatrixOT<double>_>::Assemble
          (TPZParFrontStructMatrix<TPZFrontNonSym<double>,_double,_TPZStructMatrixOT<double>_> *this
          ,TPZMatrix<double> *matref,TPZFMatrix<double> *rhs,
          TPZAutoPointer<TPZGuiInterface> *guiInterface)

{
  _func_int *p_Var1;
  int iVar2;
  int iVar3;
  TPZParFrontMatrix<double,_TPZFileEqnStorage<double>,_TPZFrontNonSym<double>_> *this_00;
  long *plVar4;
  size_type __n;
  int64_t size;
  undefined4 extraout_var;
  undefined4 extraout_var_00;
  undefined4 extraout_var_01;
  ulong uVar5;
  long lVar6;
  long lVar7;
  TPZParFrontMatrix<double,_TPZFileEqnStorage<double>,_TPZFrontNonSym<double>_> *mat;
  vector<std::thread,_std::allocator<std::thread>_> allthreads;
  TPZVec<int> numelconnected;
  thread local_88;
  size_type local_80;
  TPZParFrontStructMatrix<TPZFrontNonSym<double>,_double,_TPZStructMatrixOT<double>_> *local_78;
  TPZParFrontMatrix<double,_TPZFileEqnStorage<double>,_TPZFrontNonSym<double>_> *local_70;
  vector<std::thread,_std::allocator<std::thread>_> local_68;
  TPZVec<int> local_50;
  TPZFront<double> *this_01;
  
  TPZAutoPointer<TPZGuiInterface>::operator=
            ((TPZAutoPointer<TPZGuiInterface> *)
             &(this->
              super_TPZFrontStructMatrix<TPZFrontNonSym<double>,_double,_TPZStructMatrixOT<double>_>
              ).field_0x148,guiInterface);
  this_00 = (TPZParFrontMatrix<double,_TPZFileEqnStorage<double>,_TPZFrontNonSym<double>_> *)
            __dynamic_cast(matref,&TPZMatrix<double>::typeinfo,
                           &TPZParFrontMatrix<double,TPZFileEqnStorage<double>,TPZFrontNonSym<double>>
                            ::typeinfo,0);
  local_70 = this_00;
  if (this_00 ==
      (TPZParFrontMatrix<double,_TPZFileEqnStorage<double>,_TPZFrontNonSym<double>_> *)0x0) {
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&std::cout,
               "virtual void TPZParFrontStructMatrix<TPZFrontNonSym<double>, double, TPZStructMatrixOT<STATE>>::Assemble(TPZMatrix<TVar> &, TPZFMatrix<TVar> &, TPZAutoPointer<TPZGuiInterface>) [TFront = TPZFrontNonSym<double>, TVar = double, TPar = TPZStructMatrixOT<STATE>]"
               ,0x102);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&std::cout," we are in serious trouble : wrong type of matrix",0x31);
    std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + -0x58);
    std::ostream::put(-0x58);
    std::ostream::flush();
    pzinternal::DebugStopImpl
              ("/workspace/llm4binary/github/license_c_cmakelists/labmec[P]neopz/StrMatrix/TPZParFrontStructMatrix.cpp"
               ,0x183);
  }
  lVar6 = *(long *)(*(long *)&(this->
                              super_TPZFrontStructMatrix<TPZFrontNonSym<double>,_double,_TPZStructMatrixOT<double>_>
                              ).super_TPZStructMatrixT<double>.super_TPZStructMatrix + -0x60);
  if (*(int *)((long)&(this->
                      super_TPZFrontStructMatrix<TPZFrontNonSym<double>,_double,_TPZStructMatrixOT<double>_>
                      ).super_TPZStructMatrixT<double>.super_TPZStructMatrix.fMesh + lVar6) < 3) {
    *(undefined4 *)
     ((long)&(this->
             super_TPZFrontStructMatrix<TPZFrontNonSym<double>,_double,_TPZStructMatrixOT<double>_>)
             .super_TPZStructMatrixT<double>.super_TPZStructMatrix.fMesh + lVar6) = 3;
  }
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)&std::cout,"Number of Threads ",0x12);
  plVar4 = (long *)std::ostream::operator<<
                             (&std::cout,
                              *(int *)((long)&(this->
                                              super_TPZFrontStructMatrix<TPZFrontNonSym<double>,_double,_TPZStructMatrixOT<double>_>
                                              ).super_TPZStructMatrixT<double>.super_TPZStructMatrix
                                              .fMesh +
                                      *(long *)(*(long *)&(this->
                                                  super_TPZFrontStructMatrix<TPZFrontNonSym<double>,_double,_TPZStructMatrixOT<double>_>
                                                  ).super_TPZStructMatrixT<double>.
                                                  super_TPZStructMatrix + -0x60)));
  std::ios::widen((char)*(undefined8 *)(*plVar4 + -0x18) + (char)plVar4);
  std::ostream::put((char)plVar4);
  std::ostream::flush();
  iVar3 = *(int *)((long)&(this->
                          super_TPZFrontStructMatrix<TPZFrontNonSym<double>,_double,_TPZStructMatrixOT<double>_>
                          ).super_TPZStructMatrixT<double>.super_TPZStructMatrix.fMesh +
                  *(long *)(*(long *)&(this->
                                      super_TPZFrontStructMatrix<TPZFrontNonSym<double>,_double,_TPZStructMatrixOT<double>_>
                                      ).super_TPZStructMatrixT<double>.super_TPZStructMatrix + -0x60
                           ));
  __n = (size_type)iVar3;
  std::ostream::flush();
  std::vector<std::thread,_std::allocator<std::thread>_>::vector
            (&local_68,__n,(allocator_type *)&local_50);
  size = TPZCompMesh::NEquations
                   ((this->
                    super_TPZFrontStructMatrix<TPZFrontNonSym<double>,_double,_TPZStructMatrixOT<double>_>
                    ).super_TPZStructMatrixT<double>.super_TPZStructMatrix.fMesh);
  local_88._M_id._M_thread._0_4_ = 0;
  TPZVec<int>::TPZVec(&local_50,size,(int *)&local_88);
  this->fNElements =
       (((this->
         super_TPZFrontStructMatrix<TPZFrontNonSym<double>,_double,_TPZStructMatrixOT<double>_>).
         super_TPZStructMatrixT<double>.super_TPZStructMatrix.fMesh)->fElementVec).
       super_TPZChunkVector<TPZCompEl_*,_10>.fNElements;
  TPZFrontStructMatrix<TPZFrontNonSym<double>,_double,_TPZStructMatrixOT<double>_>::OrderElement
            (&this->
              super_TPZFrontStructMatrix<TPZFrontNonSym<double>,_double,_TPZStructMatrixOT<double>_>
            );
  TPZFrontStructMatrix<TPZFrontNonSym<double>,_double,_TPZStructMatrixOT<double>_>::
  GetNumElConnected(&this->
                     super_TPZFrontStructMatrix<TPZFrontNonSym<double>,_double,_TPZStructMatrixOT<double>_>
                    ,&local_50);
  TPZFrontMatrix<double,_TPZFileEqnStorage<double>,_TPZFrontNonSym<double>_>::SetNumElConnected
            ((TPZFrontMatrix<double,_TPZFileEqnStorage<double>,_TPZFrontNonSym<double>_> *)this_00,
             &local_50);
  p_Var1 = (this_00->
           super_TPZFrontMatrix<double,_TPZFileEqnStorage<double>,_TPZFrontNonSym<double>_>).
           super_TPZAbstractFrontMatrix<double>.super_TPZMatrix<double>.super_TPZBaseMatrix.
           super_TPZSavable._vptr_TPZSavable[0x4f];
  if (num_threads.super_argT<int>.super_arg_base.arg_set == true) {
    iVar2 = (*p_Var1)(this_00);
    this_01 = (TPZFront<double> *)CONCAT44(extraout_var,iVar2);
    iVar2 = num_threads.super_argT<int>.value;
  }
  else {
    iVar2 = (*p_Var1)(this_00);
    this_01 = (TPZFront<double> *)CONCAT44(extraout_var_00,iVar2);
    iVar2 = iVar3 + -2;
  }
  TPZFront<double>::ProductTensorMTInitData(this_01,iVar2);
  this->fStiffness = (TPZMatrix<double> *)this_00;
  this->fRhs = rhs;
  *(undefined8 *)
   &(this->super_TPZFrontStructMatrix<TPZFrontNonSym<double>,_double,_TPZStructMatrixOT<double>_>).
    field_0x150 = 0;
  this->fCurrentAssembled = 0;
  local_78 = this;
  std::thread::
  thread<void*(&)(void*),TPZParFrontStructMatrix<TPZFrontNonSym<double>,double,TPZStructMatrixOT<double>>*,void>
            (&local_88,GlobalAssemble,&local_78);
  if (local_68.super__Vector_base<std::thread,_std::allocator<std::thread>_>._M_impl.
      super__Vector_impl_data._M_start[__n - 1]._M_id._M_thread == 0) {
    local_68.super__Vector_base<std::thread,_std::allocator<std::thread>_>._M_impl.
    super__Vector_impl_data._M_start[__n - 1]._M_id._M_thread =
         CONCAT44(local_88._M_id._M_thread._4_4_,(undefined4)local_88._M_id._M_thread);
    std::thread::
    thread<void*(&)(void*),TPZParFrontMatrix<double,TPZFileEqnStorage<double>,TPZFrontNonSym<double>>*&,void>
              (&local_88,
               TPZParFrontMatrix<double,_TPZFileEqnStorage<double>,_TPZFrontNonSym<double>_>::
               WriteFile,&local_70);
    if (local_68.super__Vector_base<std::thread,_std::allocator<std::thread>_>._M_impl.
        super__Vector_impl_data._M_start[__n - 2]._M_id._M_thread == 0) {
      local_68.super__Vector_base<std::thread,_std::allocator<std::thread>_>._M_impl.
      super__Vector_impl_data._M_start[__n - 2]._M_id._M_thread =
           CONCAT44(local_88._M_id._M_thread._4_4_,(undefined4)local_88._M_id._M_thread);
      local_80 = __n;
      if (2 < iVar3) {
        uVar5 = 0;
        do {
          local_78 = this;
          std::thread::
          thread<void*(&)(void*),TPZParFrontStructMatrix<TPZFrontNonSym<double>,double,TPZStructMatrixOT<double>>*,void>
                    (&local_88,ElementAssemble,&local_78);
          if (local_68.super__Vector_base<std::thread,_std::allocator<std::thread>_>._M_impl.
              super__Vector_impl_data._M_start[uVar5]._M_id._M_thread != 0) goto LAB_0137d01e;
          local_68.super__Vector_base<std::thread,_std::allocator<std::thread>_>._M_impl.
          super__Vector_impl_data._M_start[uVar5]._M_id._M_thread =
               CONCAT44(local_88._M_id._M_thread._4_4_,(undefined4)local_88._M_id._M_thread);
          uVar5 = uVar5 + 1;
        } while (iVar3 - 2 != uVar5);
      }
      if (0 < (int)local_80) {
        lVar7 = local_80 << 3;
        lVar6 = 0;
        do {
          std::thread::join();
          lVar6 = lVar6 + 8;
        } while (lVar7 != lVar6);
      }
      iVar3 = (*(local_70->
                super_TPZFrontMatrix<double,_TPZFileEqnStorage<double>,_TPZFrontNonSym<double>_>).
                super_TPZAbstractFrontMatrix<double>.super_TPZMatrix<double>.super_TPZBaseMatrix.
                super_TPZSavable._vptr_TPZSavable[0x4f])();
      TPZFront<double>::ProductTensorMTFinish((TPZFront<double> *)CONCAT44(extraout_var_01,iVar3));
      this->fStiffness = (TPZMatrix<double> *)0x0;
      this->fRhs = (TPZFMatrix<double> *)0x0;
      local_50._vptr_TPZVec = (_func_int **)&PTR__TPZVec_01813ef0;
      if (local_50.fStore != (int *)0x0) {
        operator_delete__(local_50.fStore);
      }
      std::vector<std::thread,_std::allocator<std::thread>_>::~vector(&local_68);
      return;
    }
  }
LAB_0137d01e:
  std::terminate();
}

Assistant:

void TPZParFrontStructMatrix<TFront,TVar,TPar>::Assemble(TPZMatrix<TVar> & matref, TPZFMatrix<TVar> & rhs,TPZAutoPointer<TPZGuiInterface> guiInterface)
{
	this->fGuiInterface = guiInterface;
	
#ifdef STACKSTORAGE
	TPZParFrontMatrix<TVar, TPZStackEqnStorage<TVar>, TFront> *mat = dynamic_cast<TPZParFrontMatrix<TVar, TPZStackEqnStorage<TVar>, TFront> *>(&matref);
#else
    TPZParFrontMatrix<TVar, TPZFileEqnStorage<TVar>, TFront> *mat = dynamic_cast<TPZParFrontMatrix<TVar, TPZFileEqnStorage<TVar>, TFront>* > (&matref);
    
#endif
	if(!mat)
	{
		std::cout << __PRETTY_FUNCTION__ << " we are in serious trouble : wrong type of matrix"<< std::endl;
		DebugStop();
	}
	
	int nthreads;
	//cout << "Number of Threads " << endl;
	//cin >> nthreads;
	//fNThreads = nthreads;
    if (this->fNumThreads < 3) {
        this->fNumThreads = 3;
    }
	std::cout << "Number of Threads " << this->fNumThreads << std::endl;
	nthreads = this->fNumThreads;
	std::cout.flush();
	//int nthreads = fNThreads+1;
	
    std::vector<std::thread> allthreads(nthreads);
	int i;
	
	TPZVec <int> numelconnected(this->fMesh->NEquations(),0);
	//TPZFrontMatrix<TPZStackEqnStorage, TFront> *mat = new TPZFrontMatrix<TPZStackEqnStorage, TFront>(fMesh->NEquations());
	
	//TPZFrontMatrix<TPZFileEqnStorage, TFront> *mat = new TPZFrontMatrix<TPZFileEqnStorage, TFront>(fMesh->NEquations());
	
	
	
	
	//TPZParFrontMatrix<TPZStackEqnStorage, TFront> *mat = new TPZParFrontMatrix<TPZStackEqnStorage, TFront>(this->fMesh->NEquations());
	fNElements = this->fMesh->NElements();
	
	this->OrderElement();
	
//	this->AdjustSequenceNumbering();
    
#ifdef PZ_LOG
    if (logger.isDebugEnabled()) {
        std::stringstream sout;
        this->fMesh->Print(sout);
        LOGPZ_DEBUG(logger, sout.str())
    }
#endif
	
	this->GetNumElConnected(numelconnected);
	
	mat->SetNumElConnected(numelconnected);
	
    if (num_threads.was_set())
        mat->GetFront().ProductTensorMTInitData(num_threads.get_value());
    else
        mat->GetFront().ProductTensorMTInitData( nthreads - 2 ); // Here it initializes the multthread decomposition (comment to deactivate. Remember to coment the Finish also)
	
	fStiffness = mat;
	fRhs = &rhs;
	fCurrentElement = 0;
	fCurrentAssembled = 0;
    
	/*
	 *Triger 'n' threads passing Assemble as argument
	 */
	// try{
    allthreads[nthreads-1] = std::thread(this->GlobalAssemble,this);
//                                        this->GlobalAssemble, this, __FUNCTION__);
//	if(!res[nthreads-1]){
//#ifdef VC
//		cout << "GlobalAssemble Thread created Successfuly "<< allthreads[nthreads-1].x << endl;
//#else
//		std::cout << "GlobalAssemble Thread created Successfuly "<< allthreads[nthreads-1] << std::endl;
//#endif
//		std::cout.flush();
//	}else{
//#ifdef VC
//		std::cout << "GlobalAssemble Thread Fail "<< allthreads[nthreads-1].x << std::endl;
//#else
//		std::cout << "GlobalAssemble Thread Fail "<< allthreads[nthreads-1] << std::endl;
//#endif
//		std::cout.flush();
//		//          DebugStop();
//	}
    allthreads[nthreads-2] = std::thread(mat->WriteFile,mat);
//                                        mat->WriteFile, mat, __FUNCTION__);
//	if(!res[nthreads-2]){
//#ifdef VC
//		cout << "WriteFile Thread created Successfuly "<< allthreads[nthreads-2].x << endl;
//#else
//		std::cout << "WriteFile Thread created Successfuly "<< allthreads[nthreads-2] << std::endl;
//#endif
//		std::cout.flush();
//	}else{
//#ifdef VC
//		std::cout << "WriteFile Thread Fail "<< allthreads[nthreads-2].x << std::endl;
//#else
//		std::cout << "WriteFile Thread Fail "<< allthreads[nthreads-2] << std::endl;
//#endif
//		std::cout.flush();
//		//          DebugStop();
//	}
	
	for(i=0;i<nthreads-2;i++){
        allthreads[i] = std::thread(this->ElementAssemble,this);
//		if(!res[i]){
//#ifdef VC
//			cout << "ElementAssemble Thread "<< i+1 <<  " created Successfuly "<< allthreads[i].x << endl;
//#else
//			std::cout << "ElementAssemble Thread "<< i+1 <<  " created Successfuly "<< allthreads[i] << std::endl;
//#endif
//			std::cout.flush();
//		}else{
//			std::cout << "Error " << res[i] << "\t";
//#ifdef VC
//			std::cout << "ElementAssemble Thread "<< i+1 << " Fail " << allthreads[i].x << std::endl;
//#else
//			std::cout << "ElementAssemble Thread "<< i+1 << " Fail " << allthreads[i] << std::endl;
//#endif
//			std::cout.flush();
//		}
	}
	for(i=0;i<nthreads;i++) {
        allthreads[i].join();
	}
	
	mat->GetFront().ProductTensorMTFinish(); // Here it ends the multthread decomposition (comment to deactivate. Remember to coment the initialization also)
	fStiffness = 0;
	fRhs = 0;
    
}